

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

void __thiscall ProString::ProString(ProString *this,char *str)

{
  size_t sVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView local_38;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = str;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_38,&local_28);
  QVar2.m_data = (storage_type *)local_38.m_size;
  QVar2.m_size = (qsizetype)this;
  QString::fromLatin1(QVar2);
  this->m_offset = 0;
  sVar1 = qstrlen(local_28);
  this->m_length = (int)sVar1;
  this->m_file = 0;
  this->m_hash = 0x80000000;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProString::ProString(const char *str) :
    m_string(QString::fromLatin1(str)), m_offset(0), m_length(int(qstrlen(str))), m_file(0), m_hash(0x80000000)
{
}